

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

uint encodeRex(uchar *stream,bool operand64Bit,x86XmmReg dst,x86XmmReg src)

{
  byte bVar1;
  
  bVar1 = 7 < (int)src | (7 < (int)dst) << 2 | operand64Bit << 3;
  if (bVar1 != 0) {
    *stream = bVar1 | 0x40;
    return 1;
  }
  return 0;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86XmmReg dst, x86XmmReg src)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (dst >= rXMM8 ? 0x04 : 0x00) | (src >= rXMM8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}